

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long in_RDX;
  byte in_SIL;
  Texture *in_RDI;
  BlendMode *in_stack_00000008;
  RenderTarget *in_stack_00000010;
  Uint64 textureId;
  Shader *in_stack_ffffffffffffffc8;
  RenderTarget *in_stack_ffffffffffffffd0;
  RenderTarget *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if ((in_RDI[8].m_fboAttachment & 1U) == 0) {
    uVar3 = (**(code **)((long)in_RDI->m_size + 0x18))();
    if ((uVar3 & 1) == 0) {
      (*sf_glad_glDisable)(0x8db9);
    }
    else {
      (*sf_glad_glEnable)(0x8db9);
    }
  }
  if ((in_RDI[8].m_hasMipmap & 1U) == 0) {
    resetGLStates(in_stack_ffffffffffffffd0);
  }
  if ((bVar1 & 1) == 0) {
    applyTransform(in_stack_ffffffffffffffd0,(Transform *)in_stack_ffffffffffffffc8);
  }
  else if (((in_RDI[8].m_fboAttachment & 1U) == 0) || ((in_RDI[9].m_hasMipmap & 1U) == 0)) {
    (*sf_glad_glLoadIdentity)();
  }
  if (((in_RDI[8].m_fboAttachment & 1U) == 0) || ((in_RDI[8].field_0x1a & 1) != 0)) {
    applyCurrentView((RenderTarget *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  if (((in_RDI[8].m_fboAttachment & 1U) == 0) ||
     (bVar2 = sf::operator!=((BlendMode *)in_stack_ffffffffffffffd0,
                             (BlendMode *)in_stack_ffffffffffffffc8), bVar2)) {
    applyBlendMode(in_stack_00000010,in_stack_00000008);
  }
  if (((in_RDI[8].m_fboAttachment & 1U) == 0) ||
     ((*(long *)(in_RDX + 0x58) != 0 && ((*(byte *)(*(long *)(in_RDX + 0x58) + 0x18) & 1) != 0)))) {
    applyTexture(in_stack_ffffffffffffffe0,in_RDI);
  }
  else {
    if (*(long *)(in_RDX + 0x58) == 0) {
      in_stack_ffffffffffffffd0 = (RenderTarget *)0x0;
    }
    else {
      in_stack_ffffffffffffffd0 = *(RenderTarget **)(*(long *)(in_RDX + 0x58) + 0x20);
    }
    if (in_stack_ffffffffffffffd0 != *(RenderTarget **)&in_RDI[9].m_texture) {
      applyTexture(in_stack_ffffffffffffffd0,in_RDI);
    }
  }
  if (*(long *)(in_RDX + 0x60) != 0) {
    applyShader(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // Enable or disable sRGB encoding
    // This is needed for drivers that do not check the format of the surface drawn to before applying sRGB conversion
    if (!m_cache.enable)
    {
        if (isSrgb())
            glCheck(glEnable(GL_FRAMEBUFFER_SRGB));
        else
            glCheck(glDisable(GL_FRAMEBUFFER_SRGB));
    }

    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}